

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_GlobalMemoryAccountant_stop_Test::testBody(TEST_GlobalMemoryAccountant_stop_Test *this)

{
  TestMemoryAllocator *pTVar1;
  TestMemoryAllocator *pTVar2;
  TestMemoryAllocator *pTVar3;
  UtestShell *pUVar4;
  TestMemoryAllocator *pTVar5;
  TestTerminator *pTVar6;
  TestMemoryAllocator *originalNewArrayAllocator;
  TestMemoryAllocator *originalNewAllocator;
  TestMemoryAllocator *originalMallocAllocator;
  TEST_GlobalMemoryAccountant_stop_Test *this_local;
  
  pTVar1 = getCurrentMallocAllocator();
  pTVar2 = getCurrentNewAllocator();
  pTVar3 = getCurrentNewArrayAllocator();
  GlobalMemoryAccountant::start
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).accountant);
  GlobalMemoryAccountant::stop
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).accountant);
  pUVar4 = UtestShell::getCurrent();
  pTVar5 = getCurrentMallocAllocator();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x13])
            (pUVar4,pTVar1,pTVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x298,pTVar6);
  pUVar4 = UtestShell::getCurrent();
  pTVar1 = getCurrentNewAllocator();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x13])
            (pUVar4,pTVar2,pTVar1,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x299,pTVar6);
  pUVar4 = UtestShell::getCurrent();
  pTVar1 = getCurrentNewArrayAllocator();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x13])
            (pUVar4,pTVar3,pTVar1,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x29a,pTVar6);
  return;
}

Assistant:

TEST(GlobalMemoryAccountant, stop)
{
    TestMemoryAllocator* originalMallocAllocator = getCurrentMallocAllocator();
    TestMemoryAllocator* originalNewAllocator = getCurrentNewAllocator();
    TestMemoryAllocator* originalNewArrayAllocator = getCurrentNewArrayAllocator();

    accountant.start();
    accountant.stop();

    POINTERS_EQUAL(originalMallocAllocator, getCurrentMallocAllocator());
    POINTERS_EQUAL(originalNewAllocator, getCurrentNewAllocator());
    POINTERS_EQUAL(originalNewArrayAllocator, getCurrentNewArrayAllocator());
}